

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

void __thiscall
ImStb::stb_textedit_find_charpos
          (ImStb *this,StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  ImWchar *pIVar1;
  int line_start_idx;
  int iVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  ImVec2 IVar7;
  ImWchar *text_remaining;
  ImWchar *local_38;
  
  fVar6 = find->y;
  fVar3 = SUB84(str,0);
  if (fVar6 == fVar3) {
    if (n == 0) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0x3f800000;
      iVar4 = 0;
      iVar2 = 0;
      if ((int)fVar6 < 1) {
        iVar5 = 0;
      }
      else {
        do {
          iVar5 = iVar2;
          local_38 = (ImWchar *)0x0;
          pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)iVar5 * 4);
          InputTextCalcTextSizeW
                    (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 4),&local_38,
                     (ImVec2 *)0x1,SUB41(single_line,0));
          iVar4 = iVar5 + (int)((ulong)((long)local_38 - (long)pIVar1) >> 2);
          iVar2 = iVar4;
        } while (iVar4 < (int)fVar6);
      }
      *(int *)(this + 0xc) = iVar4;
      *(undefined4 *)(this + 0x10) = 0;
      *(int *)(this + 0x14) = iVar5;
    }
    else {
      local_38 = (ImWchar *)0x0;
      IVar7 = InputTextCalcTextSizeW
                        (*(ImWchar **)(find + 1),*(ImWchar **)(find + 1) + (int)fVar6,&local_38,
                         (ImVec2 *)0x1,SUB41(single_line,0));
      *(undefined4 *)(this + 4) = 0;
      *(undefined4 *)(this + 0xc) = 0;
      *(float *)(this + 0x10) = fVar6;
      *(float *)(this + 8) = IVar7.y;
      *(float *)this = IVar7.x;
    }
  }
  else {
    fVar6 = 0.0;
    iVar2 = 0;
    iVar4 = 0;
    while( true ) {
      line_start_idx = iVar2;
      *(float *)(this + 4) = fVar6;
      local_38 = (ImWchar *)0x0;
      pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)line_start_idx * 4);
      IVar7 = InputTextCalcTextSizeW
                        (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 4),&local_38,
                         (ImVec2 *)0x1,SUB41(single_line,0));
      iVar5 = (int)((ulong)((long)local_38 - (long)pIVar1) >> 2);
      iVar2 = line_start_idx + iVar5;
      if ((int)fVar3 < iVar2) break;
      fVar6 = IVar7.y + *(float *)(this + 4);
      iVar4 = line_start_idx;
    }
    *(int *)(this + 0xc) = line_start_idx;
    *(int *)(this + 0x10) = iVar5;
    *(float *)(this + 8) = IVar7.y;
    *(int *)(this + 0x14) = iVar4;
    *(undefined4 *)this = 0;
    if (line_start_idx < (int)fVar3) {
      iVar2 = 0;
      do {
        fVar6 = STB_TEXTEDIT_GETWIDTH((ImGuiInputTextState *)find,line_start_idx,iVar2);
        *(float *)this = fVar6 + *(float *)this;
        iVar2 = iVar2 + 1;
      } while ((int)fVar3 - line_start_idx != iVar2);
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}